

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O0

void __thiscall CppLogger::CppLogger::setFormat(CppLogger *this,Level t_Level,Format *t_Format)

{
  bool bVar1;
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_98;
  __normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
  local_80;
  FormatAttribute local_78 [4];
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_68;
  FormatAttribute *local_50;
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_48;
  __normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
  local_30;
  __normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
  local_28;
  Format *local_20;
  Format *t_Format_local;
  CppLogger *pCStack_10;
  Level t_Level_local;
  CppLogger *this_local;
  
  local_20 = t_Format;
  t_Format_local._4_4_ = t_Level;
  pCStack_10 = this;
  Format::getFormat(&local_48,t_Format);
  local_30._M_current =
       (FormatAttribute *)
       std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::begin
                 (&local_48);
  Format::getFormat(&local_68,local_20);
  local_50 = (FormatAttribute *)
             std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
             end(&local_68);
  local_78[0] = Message;
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<CppLogger::FormatAttribute*,std::vector<CppLogger::FormatAttribute,std::allocator<CppLogger::FormatAttribute>>>,CppLogger::FormatAttribute>
                       (local_30,(__normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
                                  )local_50,local_78);
  Format::getFormat(&local_98,local_20);
  local_80._M_current =
       (FormatAttribute *)
       std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::end
                 (&local_98);
  bVar1 = __gnu_cxx::
          operator==<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
                    (&local_28,&local_80);
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::~vector
            (&local_98);
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::~vector
            (&local_68);
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::~vector
            (&local_48);
  if (bVar1) {
    Format::addMessage(local_20);
  }
  Format::operator=((Format *)(&this->field_0x28 + (long)(int)(t_Format_local._4_4_ - Trace) * 0x18)
                    ,local_20);
  return;
}

Assistant:

void CppLogger::setFormat(Level t_Level, Format& t_Format) {
        if (std::find(t_Format.getFormat().begin(), t_Format.getFormat().end(), FormatAttribute::Message) == t_Format.getFormat().end()) {
            t_Format.addMessage();
        }
        m_Format[t_Level - 1] = t_Format;
    }